

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O3

void __thiscall
Centaurus::DFA<unsigned_char>::fork_states
          (DFA<unsigned_char> *this,int index,NFA<unsigned_char> *nfa)

{
  pointer pDVar1;
  pointer pNVar2;
  pointer pNVar3;
  int dest;
  long lVar4;
  int *piVar5;
  NFATransition<unsigned_char> *tr;
  value_type *__x;
  int *piVar6;
  pointer cc;
  bool long_flag;
  NFADepartureSet<unsigned_char> deptset;
  NFADepartureSetFactory<unsigned_char> ds_factory;
  set<int,_std::less<int>,_std::allocator<int>_> ec;
  bool local_b1;
  int *local_b0;
  long local_a8;
  NFADepartureSet<unsigned_char> local_a0;
  NFADepartureSetFactory<unsigned_char> local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_80._vptr_NFADepartureSetFactory = (_func_int **)&PTR__NFADepartureSetFactory_00186408;
  local_80.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = (long)index;
  pDVar1 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = lVar4 * 9;
  piVar6 = pDVar1[lVar4].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.m_label.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b0 = *(pointer *)
              ((long)&pDVar1[lVar4].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.
                      m_label.super_vector<int,_std::allocator<int>_> + 8);
  if (piVar6 != local_b0) {
    do {
      pNVar2 = (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar3 = *(pointer *)
                ((long)&pNVar2[*piVar6].m_transitions.
                        super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                        ._M_impl + 8);
      for (__x = *(value_type **)
                  &pNVar2[*piVar6].m_transitions.
                   super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                   ._M_impl; __x != pNVar3; __x = __x + 1) {
        if ((__x->m_label).m_ranges.
            super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (__x->m_label).m_ranges.
            super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
          ::push_back(&local_80.m_transitions,__x);
        }
      }
      piVar6 = piVar6 + 1;
    } while (piVar6 != local_b0);
  }
  NFADepartureSetFactory<unsigned_char>::build_departure_set(&local_a0,&local_80);
  piVar5 = (int *)(((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                          super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                          super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  piVar6 = piVar5;
  if (local_a0.
      super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      .
      super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      .
      super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = local_a8 << 3;
    cc = local_a0.
         super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         .
         super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = piVar5;
    do {
      local_b1 = false;
      NFA<unsigned_char>::epsilon_closure
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,nfa,&cc->second,
                 &local_b1);
      dest = add_state(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,local_b1);
      NFABaseState<unsigned_char,_Centaurus::IndexVector>::add_transition
                ((NFABaseState<unsigned_char,_Centaurus::IndexVector> *)
                 ((long)&(((this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).
                         _vptr_NFABaseState + local_a8),&cc->first,dest,false);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      cc = cc + 1;
    } while (cc != local_a0.
                   super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   .
                   super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    piVar5 = (int *)(((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                            super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                            super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
    piVar6 = local_b0;
  }
  piVar6 = (int *)(long)(int)piVar6;
  if (piVar6 < piVar5) {
    do {
      fork_states(this,(int)piVar6,nfa);
      piVar6 = (int *)((long)piVar6 + 1);
      piVar5 = (int *)(((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                              super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                              super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)
      ;
    } while (piVar6 <= piVar5 && (long)piVar5 - (long)piVar6 != 0);
  }
  std::
  vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~vector(&local_a0.
             super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           );
  local_80._vptr_NFADepartureSetFactory = (_func_int **)&PTR__NFADepartureSetFactory_00186408;
  std::
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ::~vector(&local_80.m_transitions);
  return;
}

Assistant:

void fork_states(int index, const NFA<TCHAR>& nfa)
	{
		NFADepartureSetFactory<TCHAR> ds_factory;

		for (int i : m_states[index].label())
		{
			for (const auto& tr : nfa.get_transitions(i))
			{
				ds_factory.add(tr);
			}
		}

		NFADepartureSet<TCHAR> deptset = ds_factory.build_departure_set();

		int initial_index = m_states.size();
		for (const auto& item : deptset)
		{
            bool long_flag = false;
			std::set<int> ec = nfa.epsilon_closure(item.second, long_flag);

			int new_index = add_state(ec, long_flag);

			//std::cout << "S" << index << "->" << new_index << std::endl;

			m_states[index].add_transition(item.first, new_index);
		}

		for (int i = initial_index; i < m_states.size(); i++)
		{
			fork_states(i, nfa);
		}
	}